

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidTimingControl * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
          (BumpAllocator *this,TimingControl **args)

{
  InvalidTimingControl *this_00;
  TimingControl **args_local;
  BumpAllocator *this_local;
  
  this_00 = (InvalidTimingControl *)allocate(this,0x28,8);
  ast::InvalidTimingControl::InvalidTimingControl(this_00,*args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }